

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O3

UnicodeSet * __thiscall
icu_63::Transliterator::getSourceSet(Transliterator *this,UnicodeSet *result)

{
  UnicodeSet *pUVar1;
  UnicodeSet *p;
  
  (*(this->super_UObject)._vptr_UObject[0xf])();
  pUVar1 = (UnicodeSet *)this->filter;
  if (pUVar1 != (UnicodeSet *)0x0) {
    if ((pUVar1->super_UnicodeFilter).super_UnicodeFunctor.super_UObject._vptr_UObject ==
        (_func_int **)&PTR__UnicodeSet_00487cb8) {
      UnicodeSet::retainAll(result,pUVar1);
    }
    else {
      pUVar1 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar1);
      if (pUVar1 != (UnicodeSet *)0x0) {
        UnicodeSet::UnicodeSet(pUVar1);
        (*(this->filter->super_UnicodeMatcher)._vptr_UnicodeMatcher[5])
                  (&this->filter->super_UnicodeMatcher,pUVar1);
        p = pUVar1;
        UnicodeSet::retainAll(result,pUVar1);
        UnicodeSet::~UnicodeSet(pUVar1);
        UMemory::operator_delete((UMemory *)pUVar1,p);
      }
    }
  }
  return result;
}

Assistant:

UnicodeSet& Transliterator::getSourceSet(UnicodeSet& result) const {
    handleGetSourceSet(result);
    if (filter != NULL) {
        UnicodeSet* filterSet = dynamic_cast<UnicodeSet*>(filter);
        UBool deleteFilterSet = FALSE;
        // Most, but not all filters will be UnicodeSets.  Optimize for
        // the high-runner case.
        if (filterSet == NULL) {
            filterSet = new UnicodeSet();
            // Check null pointer
            if (filterSet == NULL) {
                return result;
            }
            deleteFilterSet = TRUE;
            filter->addMatchSetTo(*filterSet);
        }
        result.retainAll(*filterSet);
        if (deleteFilterSet) {
            delete filterSet;
        }
    }
    return result;
}